

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdflib.cpp
# Opt level: O3

double rlog(double *x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = *x;
  if ((0.61 <= dVar1) && (dVar1 <= 1.57)) {
    if (0.82 <= dVar1) {
      if (dVar1 <= 1.18) {
        dVar1 = dVar1 + -0.5 + -0.5;
        dVar2 = 0.0;
      }
      else {
        dVar1 = dVar1 * 0.75 + -1.0;
        dVar2 = dVar1 / 3.0 + 0.0456512608815524;
      }
    }
    else {
      dVar1 = (dVar1 + -0.7) / 0.7;
      dVar2 = dVar1 * -0.3 + 0.0566749439387324;
    }
    dVar1 = dVar1 / (dVar1 + 2.0);
    dVar3 = dVar1 * dVar1;
    return (1.0 / (1.0 - dVar1) -
           (((dVar3 * 0.00620886815375787 + -0.224696413112536) * dVar3 + 0.333333333333333) /
           ((dVar3 * 0.354508718369557 + -1.27408923933623) * dVar3 + 1.0)) * dVar1) *
           (dVar3 + dVar3) + dVar2;
  }
  dVar2 = log(dVar1);
  return (dVar1 + -0.5 + -0.5) - dVar2;
}

Assistant:

double rlog ( double *x )

//****************************************************************************80
//
//  Purpose:
//
//    RLOG computes  X - 1 - LN(X).
//
//  Modified:
//
//    09 December 1999
//
//  Parameters:
//
//    Input, double *X, the argument of the function.
//
//    Output, double RLOG, the value of the function.
//
{
  static double a = .566749439387324e-01;
  static double b = .456512608815524e-01;
  static double p0 = .333333333333333e+00;
  static double p1 = -.224696413112536e+00;
  static double p2 = .620886815375787e-02;
  static double q1 = -.127408923933623e+01;
  static double q2 = .354508718369557e+00;
  static double rlog,r,t,u,w,w1;

    if(*x < 0.61e0 || *x > 1.57e0) goto S40;
    if(*x < 0.82e0) goto S10;
    if(*x > 1.18e0) goto S20;
//
//              ARGUMENT REDUCTION
//
    u = *x-0.5e0-0.5e0;
    w1 = 0.0e0;
    goto S30;
S10:
    u = *x-0.7e0;
    u /= 0.7e0;
    w1 = a-u*0.3e0;
    goto S30;
S20:
    u = 0.75e0**x-1.e0;
    w1 = b+u/3.0e0;
S30:
//
//               SERIES EXPANSION
//
    r = u/(u+2.0e0);
    t = r*r;
    w = ((p2*t+p1)*t+p0)/((q2*t+q1)*t+1.0e0);
    rlog = 2.0e0*t*(1.0e0/(1.0e0-r)-r*w)+w1;
    return rlog;
S40:
    r = *x-0.5e0-0.5e0;
    rlog = r-log(*x);
    return rlog;
}